

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-decompress.c
# Opt level: O2

cc_bool PopDescriptor(KosinskiDecompressCallbacks *callbacks)

{
  uint uVar1;
  
  uVar1 = descriptor;
  descriptor = descriptor >> 1;
  descriptor_bits_remaining = descriptor_bits_remaining - 1;
  if (descriptor_bits_remaining == 0) {
    GetDescriptor(callbacks);
  }
  return (byte)uVar1 & 1;
}

Assistant:

static cc_bool PopDescriptor(const KosinskiDecompressCallbacks* const callbacks)
{
	const cc_bool result = (descriptor & 1) != 0;

	descriptor >>= 1;

	if (--descriptor_bits_remaining == 0)
		GetDescriptor(callbacks);

	return result;
}